

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::NeuralNetwork::MergePartialFromCodedStream
          (NeuralNetwork *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  Type *this_00;
  Type *this_01;
  NetworkUpdateParameters *pNVar6;
  pair<int,_int> pVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001ed9c3;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001ed9c3:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    uVar5 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_001eda2e_caseD_3;
    cVar8 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\n') break;
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (&(this->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar9 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
        bVar4 = true;
      }
      else {
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar4 = -1 < iVar9;
      }
      iVar11 = 6;
      if (!bVar4) goto LAB_001eda11;
      pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar9);
      if ((long)pVar7 < 0) {
LAB_001edc33:
        iVar11 = 6;
        goto LAB_001eda11;
      }
      bVar4 = NeuralNetworkLayer::MergePartialFromCodedStream(this_00,input);
LAB_001edc13:
      iVar11 = 6;
      if (bVar4 == false) goto LAB_001edc33;
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar7.first);
      if (!bVar4) goto LAB_001eda11;
      goto LAB_001eda0e;
    case 2:
      if (cVar8 != '\x12') break;
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                          (&(this->preprocessing_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar9 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
        bVar4 = true;
      }
      else {
        iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar4 = -1 < iVar9;
      }
      iVar11 = 6;
      if (bVar4) {
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar9);
        if (-1 < (long)pVar7) {
          bVar4 = NeuralNetworkPreprocessing::MergePartialFromCodedStream(this_01,input);
          goto LAB_001edc13;
        }
        goto LAB_001edc33;
      }
      goto LAB_001eda11;
    case 5:
      if (cVar8 == '(') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001edc4f;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_001edc4f:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar10;
        }
        if (!bVar4) goto LAB_001edcaa;
        this->arrayinputshapemapping_ = (int)uVar10;
LAB_001edc9a:
        iVar11 = 0;
LAB_001edc9d:
        if (bVar4) goto LAB_001eda0e;
        goto LAB_001eda11;
      }
      break;
    case 6:
      if (cVar8 == '0') {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_001edc79;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_001edc79:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar10;
        }
        if (bVar4) {
          this->imageinputshapemapping_ = (int)uVar10;
          goto LAB_001edc9a;
        }
LAB_001edcaa:
        iVar11 = 6;
        goto LAB_001edc9d;
      }
      break;
    case 10:
      if (cVar8 == 'R') {
        if (this->updateparams_ == (NetworkUpdateParameters *)0x0) {
          pNVar6 = (NetworkUpdateParameters *)operator_new(0x50);
          NetworkUpdateParameters::NetworkUpdateParameters(pNVar6);
          this->updateparams_ = pNVar6;
        }
        pNVar6 = this->updateparams_;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar9 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
          input->buffer_ = puVar3 + 1;
          bVar4 = true;
        }
        else {
          iVar9 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar4 = -1 < iVar9;
        }
        iVar11 = 6;
        if (bVar4) {
          pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar9);
          if (-1 < (long)pVar7) {
            bVar4 = NetworkUpdateParameters::MergePartialFromCodedStream(pNVar6,input);
            goto LAB_001edc13;
          }
          goto LAB_001edc33;
        }
        goto LAB_001eda11;
      }
    }
switchD_001eda2e_caseD_3:
    iVar11 = 7;
    if ((uVar5 & 7) != 4 && uVar5 != 0) {
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
      if (bVar4) {
LAB_001eda0e:
        iVar11 = 0;
      }
      else {
        iVar11 = 6;
      }
    }
LAB_001eda11:
    if (iVar11 != 0) {
      return iVar11 != 6;
    }
  } while( true );
}

Assistant:

bool NeuralNetwork::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NeuralNetwork)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_preprocessing()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_arrayinputshapemapping(static_cast< ::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_imageinputshapemapping(static_cast< ::CoreML::Specification::NeuralNetworkImageShapeMapping >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_updateparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NeuralNetwork)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NeuralNetwork)
  return false;
#undef DO_
}